

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_next(archive *a,archive_acl *acl,wchar_t want_type,wchar_t *type,
                        wchar_t *permset,wchar_t *tag,wchar_t *id,char **name)

{
  wchar_t wVar1;
  int *piVar2;
  undefined4 *in_RCX;
  uint in_EDX;
  uint *in_RSI;
  uint *in_R8;
  archive *in_R9;
  undefined4 *in_stack_00000008;
  char **in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  uint uVar3;
  uint in_stack_ffffffffffffffc4;
  wchar_t local_4;
  
  tag[0] = L'\0';
  tag[1] = L'\0';
  *in_stack_00000008 = 0xffffffff;
  if (in_RSI[6] == 0) {
    return L'\xffffffec';
  }
  if ((in_EDX & 0x100) != 0) {
    in_stack_ffffffffffffffc4 = in_RSI[6];
    if (in_stack_ffffffffffffffc4 == 0x2712) {
      *in_R8 = *in_RSI >> 6 & 7;
      *in_RCX = 0x100;
      in_R9->magic = 0x2712;
      in_RSI[6] = 0x2714;
      return L'\0';
    }
    if (in_stack_ffffffffffffffc4 == 0x2714) {
      *in_R8 = *in_RSI >> 3 & 7;
      *in_RCX = 0x100;
      in_R9->magic = 0x2714;
      in_RSI[6] = 0x2716;
      return L'\0';
    }
    if (in_stack_ffffffffffffffc4 == 0x2716) {
      *in_R8 = *in_RSI & 7;
      *in_RCX = 0x100;
      in_R9->magic = 0x2716;
      in_RSI[6] = 0xffffffff;
      *(undefined8 *)(in_RSI + 4) = *(undefined8 *)(in_RSI + 2);
      return L'\0';
    }
  }
  while( true ) {
    uVar3 = in_stack_ffffffffffffffc0 & 0xffffff;
    if (*(long *)(in_RSI + 4) != 0) {
      uVar3 = CONCAT13((*(uint *)(*(long *)(in_RSI + 4) + 8) & in_EDX) == 0,
                       (int3)in_stack_ffffffffffffffc0);
    }
    if ((char)(uVar3 >> 0x18) == '\0') break;
    *(undefined8 *)(in_RSI + 4) = **(undefined8 **)(in_RSI + 4);
    in_stack_ffffffffffffffc0 = uVar3;
  }
  if (*(long *)(in_RSI + 4) == 0) {
    in_RSI[6] = 0;
    *in_RCX = 0;
    *in_R8 = 0;
    in_R9->magic = 0;
    *in_stack_00000008 = 0xffffffff;
    tag[0] = L'\0';
    tag[1] = L'\0';
    local_4 = L'\x01';
  }
  else {
    *in_RCX = *(undefined4 *)(*(long *)(in_RSI + 4) + 8);
    *in_R8 = *(uint *)(*(long *)(in_RSI + 4) + 0x10);
    in_R9->magic = *(uint *)(*(long *)(in_RSI + 4) + 0xc);
    *in_stack_00000008 = *(undefined4 *)(*(long *)(in_RSI + 4) + 0x14);
    wVar1 = archive_mstring_get_mbs
                      (in_R9,(archive_mstring *)CONCAT44(in_stack_ffffffffffffffc4,uVar3),
                       in_stack_ffffffffffffffb8);
    if (wVar1 != L'\0') {
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        return L'\xffffffe2';
      }
      tag[0] = L'\0';
      tag[1] = L'\0';
    }
    *(undefined8 *)(in_RSI + 4) = **(undefined8 **)(in_RSI + 4);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
archive_acl_next(struct archive *a, struct archive_acl *acl, int want_type, int *type,
    int *permset, int *tag, int *id, const char **name)
{
	*name = NULL;
	*id = -1;

	/*
	 * The acl_state is either zero (no entries available), -1
	 * (reading from list), or an entry type (retrieve that type
	 * from ae_stat.aest_mode).
	 */
	if (acl->acl_state == 0)
		return (ARCHIVE_WARN);

	/* The first three access entries are special. */
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		switch (acl->acl_state) {
		case ARCHIVE_ENTRY_ACL_USER_OBJ:
			*permset = (acl->mode >> 6) & 7;
			*type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
			*tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
			acl->acl_state = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
			return (ARCHIVE_OK);
		case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
			*permset = (acl->mode >> 3) & 7;
			*type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
			*tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
			acl->acl_state = ARCHIVE_ENTRY_ACL_OTHER;
			return (ARCHIVE_OK);
		case ARCHIVE_ENTRY_ACL_OTHER:
			*permset = acl->mode & 7;
			*type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
			*tag = ARCHIVE_ENTRY_ACL_OTHER;
			acl->acl_state = -1;
			acl->acl_p = acl->acl_head;
			return (ARCHIVE_OK);
		default:
			break;
		}
	}

	while (acl->acl_p != NULL && (acl->acl_p->type & want_type) == 0)
		acl->acl_p = acl->acl_p->next;
	if (acl->acl_p == NULL) {
		acl->acl_state = 0;
		*type = 0;
		*permset = 0;
		*tag = 0;
		*id = -1;
		*name = NULL;
		return (ARCHIVE_EOF); /* End of ACL entries. */
	}
	*type = acl->acl_p->type;
	*permset = acl->acl_p->permset;
	*tag = acl->acl_p->tag;
	*id = acl->acl_p->id;
	if (archive_mstring_get_mbs(a, &acl->acl_p->name, name) != 0) {
		if (errno == ENOMEM)
			return (ARCHIVE_FATAL);
		*name = NULL;
	}
	acl->acl_p = acl->acl_p->next;
	return (ARCHIVE_OK);
}